

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_peer_eviction_tests.cpp
# Opt level: O2

bool net_peer_eviction_tests::IsEvicted
               (int number_of_nodes,function<void_(NodeEvictionCandidate_&)> candidate_setup_fn,
               unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
               *node_ids,FastRandomContext *random_context)

{
  bool bVar1;
  FastRandomContext *in_RCX;
  NodeEvictionCandidate *candidate;
  pointer __args;
  long in_FS_OFFSET;
  _Vector_impl_data in_stack_ffffffffffffff98;
  _Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> local_48;
  __node_base_ptr local_30;
  
  local_30 = *(__node_base_ptr *)(in_FS_OFFSET + 0x28);
  GetRandomNodeEvictionCandidates
            ((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)&local_48,
             number_of_nodes,in_RCX);
  for (__args = local_48._M_impl.super__Vector_impl_data._M_start;
      __args != local_48._M_impl.super__Vector_impl_data._M_finish; __args = __args + 1) {
    std::function<void_(NodeEvictionCandidate_&)>::operator()
              ((function<void_(NodeEvictionCandidate_&)> *)node_ids,__args);
  }
  std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::vector
            ((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)
             &stack0xffffffffffffffa0,
             (vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)&local_48);
  bVar1 = IsEvicted((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)
                    in_stack_ffffffffffffff98,
                    (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                     *)&stack0xffffffffffffffa0,random_context);
  std::_Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::~_Vector_base
            ((_Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)
             &stack0xffffffffffffffa0);
  std::_Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::~_Vector_base
            (&local_48);
  if (*(__node_base_ptr *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool IsEvicted(const int number_of_nodes, std::function<void(NodeEvictionCandidate&)> candidate_setup_fn, const std::unordered_set<NodeId>& node_ids, FastRandomContext& random_context)
{
    std::vector<NodeEvictionCandidate> candidates = GetRandomNodeEvictionCandidates(number_of_nodes, random_context);
    for (NodeEvictionCandidate& candidate : candidates) {
        candidate_setup_fn(candidate);
    }
    return IsEvicted(candidates, node_ids, random_context);
}